

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

bool __thiscall
gui::DrawWindow(gui *this,IFrameBuffer *fb,TRect client,CWindow *wnd,bool parentDirty)

{
  TRect rect;
  IFrameBuffer *fb_00;
  TPoint TVar1;
  int y0;
  CWindow *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  Children *this_01;
  reference psVar5;
  TPoint TVar6;
  TRect client_00;
  byte local_105;
  undefined1 local_e0 [8];
  shared_ptr<gui::CWindow> child;
  const_iterator __end1;
  const_iterator __begin1;
  Children *__range1;
  TRect thisRect;
  bool dirty;
  undefined1 local_98 [8];
  CTranslatedFrameBuffer tfb;
  undefined1 local_60 [8];
  CClippedFrameBuffer cfb;
  int local_38;
  int y;
  int x;
  bool parentDirty_local;
  CWindow *wnd_local;
  IFrameBuffer *fb_local;
  TRect client_local;
  
  _x = client.p1;
  client_local.p0 = client.p0;
  y._3_1_ = (byte)wnd & 1;
  wnd_local = (CWindow *)this;
  unique0x1000031a = (TPoint)fb;
  bVar2 = CWindow::Visible((CWindow *)_x);
  if (bVar2) {
    CWindow::GetAbsoluteCoords((CWindow *)_x,&local_38,(int *)((long)&cfb.m_base + 4));
    tfb.m_p = stack0xffffffffffffffe4;
    rect.p1 = client_local.p0;
    rect.p0 = stack0xffffffffffffffe4;
    CClippedFrameBuffer::CClippedFrameBuffer
              ((CClippedFrameBuffer *)local_60,(IFrameBuffer *)wnd_local,rect);
    TPoint::TPoint((TPoint *)&thisRect.p1.y,local_38,cfb.m_base._4_4_);
    CTranslatedFrameBuffer::CTranslatedFrameBuffer
              ((CTranslatedFrameBuffer *)local_98,(IFrameBuffer *)local_60,stack0xffffffffffffff60);
    bVar2 = CWindow::IsDirty((CWindow *)_x);
    local_105 = 1;
    if (!bVar2) {
      local_105 = y._3_1_;
    }
    thisRect.p1.x._3_1_ = local_105 & 1;
    if (thisRect.p1.x._3_1_ != 0) {
      (**(code **)(*(long *)_x + 0x40))(_x,local_98);
    }
    y0 = cfb.m_base._4_4_;
    iVar3 = CWindow::GetWidth((CWindow *)_x);
    iVar4 = CWindow::GetHeight((CWindow *)_x);
    TRect::TRect((TRect *)((long)&__range1 + 4),local_38,y0,local_38 + iVar3 + -1,
                 cfb.m_base._4_4_ + iVar4 + -1);
    bVar2 = TRect::ClipRect((TRect *)((long)&fb_local + 4),(TRect *)((long)&__range1 + 4));
    if (bVar2) {
      this_01 = CWindow::GetChildren_abi_cxx11_((CWindow *)_x);
      __end1 = std::__cxx11::
               list<std::shared_ptr<gui::CWindow>,_std::allocator<std::shared_ptr<gui::CWindow>_>_>
               ::begin(this_01);
      child.super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::
           list<std::shared_ptr<gui::CWindow>,_std::allocator<std::shared_ptr<gui::CWindow>_>_>::end
                     (this_01);
      while( true ) {
        bVar2 = std::operator!=(&__end1,(_Self *)&child.
                                                  super___shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
        if (!bVar2) break;
        psVar5 = std::_List_const_iterator<std::shared_ptr<gui::CWindow>_>::operator*(&__end1);
        std::shared_ptr<gui::CWindow>::shared_ptr((shared_ptr<gui::CWindow> *)local_e0,psVar5);
        this_00 = wnd_local;
        TVar1 = thisRect.p0;
        fb_00 = stack0xffffffffffffff4c;
        TVar6 = (TPoint)std::__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<gui::CWindow,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_e0);
        client_00.p1 = TVar6;
        client_00.p0 = TVar1;
        bVar2 = DrawWindow((gui *)this_00,fb_00,client_00,
                           (CWindow *)(ulong)(thisRect.p1.x._3_1_ & 1),parentDirty);
        thisRect.p1.x._3_1_ = (thisRect.p1.x._3_1_ & 1) != 0 || bVar2;
        std::shared_ptr<gui::CWindow>::~shared_ptr((shared_ptr<gui::CWindow> *)local_e0);
        std::_List_const_iterator<std::shared_ptr<gui::CWindow>_>::operator++(&__end1);
      }
      CWindow::SetDirty((CWindow *)_x,false);
      client_local.p1.x._3_1_ = (bool)(thisRect.p1.x._3_1_ & 1);
    }
    else {
      client_local.p1.x._3_1_ = false;
    }
  }
  else {
    client_local.p1.x._3_1_ = false;
  }
  return client_local.p1.x._3_1_;
}

Assistant:

bool DrawWindow(IFrameBuffer &fb, TRect client, CWindow &wnd, bool parentDirty) {
    if (!wnd.Visible()) {
        return false;
    }

    int x, y;
    wnd.GetAbsoluteCoords(x, y);

    CClippedFrameBuffer cfb(fb, client);
    CTranslatedFrameBuffer tfb(cfb, TPoint(x, y));

    auto dirty = wnd.IsDirty() || parentDirty;
    if (dirty) {
        wnd.Draw(tfb);
    }

    auto thisRect = TRect(x, y, x + wnd.GetWidth() - 1, y + wnd.GetHeight() - 1);
    if (!client.ClipRect(thisRect)) {
        return false;
    }

    for (auto child : wnd.GetChildren()) {
        dirty |= DrawWindow(fb, thisRect, *child.get(), dirty);
    }

    wnd.SetDirty(false);
    return dirty;
}